

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  secp256k1_fe *r_00;
  uint64_t *puVar1;
  int *piVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_EAX;
  uint32_t uVar10;
  long lVar11;
  uint count;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  size_t unaff_RBP;
  secp256k1_gej *psVar15;
  secp256k1_gej *__src;
  ulong uVar16;
  secp256k1_ge *a_00;
  secp256k1_gej *b;
  secp256k1_gej *__src_00;
  secp256k1_gej *psVar17;
  ulong uVar18;
  secp256k1_ge *psVar19;
  ulong uVar20;
  secp256k1_ge *r_01;
  ulong uVar21;
  secp256k1_fe *psVar22;
  secp256k1_ge *psVar23;
  secp256k1_ge *unaff_R13;
  size_t sVar24;
  uint uVar25;
  secp256k1_fe *psVar26;
  bool bVar27;
  byte bVar28;
  undefined1 auVar29 [16];
  secp256k1_fe u;
  undefined1 auStack_580 [56];
  ulong uStack_548;
  ulong uStack_540;
  ulong uStack_538;
  ulong uStack_530;
  ulong uStack_528;
  secp256k1_ge sStack_520;
  secp256k1_ge *psStack_4b8;
  undefined1 auStack_4b0 [56];
  uint64_t uStack_478;
  uint64_t uStack_470;
  uint64_t uStack_468;
  uint64_t uStack_460;
  int iStack_458;
  secp256k1_ge sStack_440;
  secp256k1_ge sStack_3d0;
  secp256k1_gej sStack_360;
  secp256k1_fe *psStack_2c8;
  secp256k1_ge *psStack_2c0;
  secp256k1_fe *psStack_2b8;
  secp256k1_ge *psStack_2b0;
  secp256k1_fe *psStack_2a8;
  secp256k1_ge *psStack_2a0;
  undefined1 auStack_290 [92];
  int iStack_234;
  secp256k1_ge sStack_230;
  secp256k1_fe sStack_1c8;
  secp256k1_fe sStack_198;
  secp256k1_gej *psStack_160;
  secp256k1_gej *psStack_158;
  secp256k1_fe *psStack_150;
  undefined1 *puStack_148;
  secp256k1_fe *psStack_140;
  secp256k1_fe *psStack_138;
  secp256k1_gej sStack_130;
  size_t sStack_98;
  secp256k1_ge *psStack_90;
  secp256k1_ge *psStack_88;
  secp256k1_ge *psStack_80;
  secp256k1_gej *psStack_78;
  code *pcStack_70;
  size_t local_68;
  uint64_t local_60;
  uint64_t uStack_58;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  undefined8 uStack_38;
  
  bVar28 = 0;
  psVar15 = a;
  sVar24 = len;
  local_68 = len;
  if (len == 0) {
    sVar24 = 0xffffffffffffffff;
  }
  else {
    do {
      pcStack_70 = (code *)0x14d897;
      secp256k1_gej_verify(psVar15);
      sVar24 = sVar24 - 1;
      psVar15 = psVar15 + 1;
    } while (sVar24 != 0);
    psVar22 = &a->z;
    sVar24 = 0xffffffffffffffff;
    unaff_RBP = 0;
    unaff_R13 = r;
    do {
      if ((int)psVar22[1].n[0] == 0) {
        if (sVar24 == 0xffffffffffffffff) {
          uVar7 = psVar22->n[0];
          uVar4 = psVar22->n[1];
          uVar5 = psVar22->n[2];
          uVar6 = psVar22->n[3];
          iVar8 = psVar22->magnitude;
          iVar3 = psVar22->normalized;
          (unaff_R13->x).n[4] = psVar22->n[4];
          (unaff_R13->x).magnitude = iVar8;
          (unaff_R13->x).normalized = iVar3;
          (unaff_R13->x).n[2] = uVar5;
          (unaff_R13->x).n[3] = uVar6;
          (unaff_R13->x).n[0] = uVar7;
          (unaff_R13->x).n[1] = uVar4;
          sVar24 = unaff_RBP;
        }
        else {
          pcStack_70 = (code *)0x14d8e7;
          secp256k1_fe_mul(&unaff_R13->x,&r[sVar24].x,psVar22);
          sVar24 = unaff_RBP;
        }
      }
      else {
        pcStack_70 = (code *)0x14d8c6;
        secp256k1_ge_set_infinity(unaff_R13);
        len = local_68;
      }
      unaff_RBP = unaff_RBP + 1;
      unaff_R13 = unaff_R13 + 1;
      psVar22 = (secp256k1_fe *)(psVar22[3].n + 1);
    } while (len != unaff_RBP);
  }
  if (sVar24 == 0xffffffffffffffff) {
    return;
  }
  psVar23 = (secp256k1_ge *)(sVar24 * 0x68);
  psVar15 = (secp256k1_gej *)(r + sVar24);
  b = (secp256k1_gej *)&stack0xffffffffffffffa0;
  pcStack_70 = (code *)0x14d947;
  secp256k1_fe_inv_var((secp256k1_fe *)b,(secp256k1_fe *)psVar15);
  sVar14 = local_68;
  if (sVar24 != 0) {
    unaff_RBP = sVar24 - 1;
    unaff_R13 = (secp256k1_ge *)&a[sVar24 - 1].infinity;
    psVar23 = r + -1 + sVar24;
    do {
      if ((int)(unaff_R13->x).n[0] == 0) {
        pcStack_70 = (code *)0x14d98b;
        secp256k1_fe_mul(&r[sVar24].x,&psVar23->x,(secp256k1_fe *)&stack0xffffffffffffffa0);
        sVar14 = local_68;
        psVar15 = (secp256k1_gej *)&stack0xffffffffffffffa0;
        pcStack_70 = (code *)0x14d9ab;
        b = psVar15;
        secp256k1_fe_mul((secp256k1_fe *)psVar15,(secp256k1_fe *)psVar15,&a[sVar24].z);
        sVar24 = unaff_RBP;
      }
      unaff_R13 = (secp256k1_ge *)(unaff_R13[-2].y.n + 1);
      psVar23 = psVar23 + -1;
      bVar27 = unaff_RBP != 0;
      unaff_RBP = unaff_RBP - 1;
    } while (bVar27);
  }
  if (a[sVar24].infinity == 0) {
    puVar1 = r[sVar24].x.n + 4;
    *puVar1 = local_40;
    puVar1[1] = uStack_38;
    puVar1 = r[sVar24].x.n + 2;
    *puVar1 = local_50;
    puVar1[1] = uStack_48;
    r[sVar24].x.n[0] = local_60;
    r[sVar24].x.n[1] = uStack_58;
    psVar23 = r;
    sVar24 = sVar14;
    if (sVar14 == 0) {
      return;
    }
    do {
      if (a->infinity == 0) {
        pcStack_70 = (code *)0x14da1e;
        secp256k1_ge_set_gej_zinv(psVar23,a,&psVar23->x);
      }
      a = a + 1;
      sVar24 = sVar24 - 1;
      psVar23 = psVar23 + 1;
    } while (sVar24 != 0);
    do {
      pcStack_70 = (code *)0x14da36;
      secp256k1_ge_verify(r);
      r = r + 1;
      sVar14 = sVar14 - 1;
    } while (sVar14 != 0);
    return;
  }
  pcStack_70 = test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  __src_00 = &sStack_130;
  psVar17 = &sStack_130;
  psStack_138 = (secp256k1_fe *)0x14da7d;
  sStack_98 = sVar14;
  psStack_90 = psVar23;
  psStack_88 = unaff_R13;
  psStack_80 = r;
  psStack_78 = a;
  pcStack_70 = (code *)unaff_RBP;
  memcpy(&sStack_130,b,0x98);
  psStack_138 = (secp256k1_fe *)0x14da85;
  secp256k1_gej_verify(&sStack_130);
  psStack_138 = (secp256k1_fe *)0x14da8d;
  secp256k1_gej_verify(psVar15);
  psStack_138 = (secp256k1_fe *)0x14da9a;
  secp256k1_fe_cmov(&sStack_130.x,&psVar15->x,0);
  psVar22 = &psVar15->y;
  psStack_138 = (secp256k1_fe *)0x14daad;
  secp256k1_fe_cmov(&sStack_130.y,psVar22,0);
  r_00 = &sStack_130.z;
  psVar26 = &psVar15->z;
  psStack_138 = (secp256k1_fe *)0x14dac3;
  secp256k1_fe_cmov(r_00,psVar26,0);
  psStack_138 = (secp256k1_fe *)0x14dacb;
  secp256k1_gej_verify(&sStack_130);
  psStack_138 = (secp256k1_fe *)0x14dad6;
  __src = b;
  iVar8 = gej_xyz_equals_gej(&sStack_130,b);
  if (iVar8 == 0) {
    psStack_138 = (secp256k1_fe *)0x14db6d;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_138 = (secp256k1_fe *)0x14dae9;
    secp256k1_gej_verify(&sStack_130);
    psStack_138 = (secp256k1_fe *)0x14daf1;
    secp256k1_gej_verify(psVar15);
    psStack_138 = (secp256k1_fe *)0x14db01;
    secp256k1_fe_cmov(&sStack_130.x,&psVar15->x,1);
    psStack_138 = (secp256k1_fe *)0x14db13;
    secp256k1_fe_cmov(&sStack_130.y,psVar22,1);
    psStack_138 = (secp256k1_fe *)0x14db23;
    secp256k1_fe_cmov(r_00,psVar26,1);
    sStack_130.infinity = sStack_130.infinity & 0xfffffffeU | psVar15->infinity & 1U;
    psStack_138 = (secp256k1_fe *)0x14db47;
    secp256k1_gej_verify(&sStack_130);
    psStack_138 = (secp256k1_fe *)0x14db52;
    __src = psVar15;
    iVar8 = gej_xyz_equals_gej(&sStack_130,psVar15);
    __src_00 = psVar17;
    if (iVar8 != 0) {
      return;
    }
  }
  psStack_138 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_138 = psVar26;
  psStack_140 = psVar22;
  puStack_148 = (undefined1 *)&sStack_130;
  psStack_150 = r_00;
  psStack_158 = b;
  psStack_160 = psVar15;
  if ((*(int *)((long)__src_00 + 0x90) != __src->infinity) || (*(int *)((long)__src_00 + 0x90) != 0)
     ) {
    return;
  }
  psVar22 = (secp256k1_fe *)(sStack_230.y.n + 1);
  psStack_2a0 = (secp256k1_ge *)0x14dbbf;
  memcpy(psVar22,__src_00,0x98);
  psVar23 = (secp256k1_ge *)auStack_290;
  psStack_2a0 = (secp256k1_ge *)0x14dbd4;
  memcpy(psVar23,__src,0x98);
  psStack_2a0 = (secp256k1_ge *)0x14dbdc;
  secp256k1_fe_normalize(psVar22);
  psVar26 = &sStack_1c8;
  psStack_2a0 = (secp256k1_ge *)0x14dbec;
  secp256k1_fe_normalize(psVar26);
  psStack_2a0 = (secp256k1_ge *)0x14dbfc;
  secp256k1_fe_normalize(&sStack_198);
  psStack_2a0 = (secp256k1_ge *)0x14dc04;
  secp256k1_fe_normalize((secp256k1_fe *)psVar23);
  psVar19 = (secp256k1_ge *)(auStack_290 + 0x30);
  psStack_2a0 = (secp256k1_ge *)0x14dc11;
  secp256k1_fe_normalize((secp256k1_fe *)psVar19);
  psStack_2a0 = (secp256k1_ge *)0x14dc1e;
  secp256k1_fe_normalize(&sStack_230.x);
  psStack_2a0 = (secp256k1_ge *)0x14dc26;
  secp256k1_fe_verify(psVar22);
  psStack_2a0 = (secp256k1_ge *)0x14dc2e;
  a_00 = psVar23;
  secp256k1_fe_verify((secp256k1_fe *)psVar23);
  if (sStack_230._100_4_ == 0) {
    psStack_2a0 = (secp256k1_ge *)0x14dd33;
    gej_xyz_equals_gej_cold_6();
LAB_0014dd33:
    psStack_2a0 = (secp256k1_ge *)0x14dd38;
    gej_xyz_equals_gej_cold_5();
LAB_0014dd38:
    psStack_2a0 = (secp256k1_ge *)0x14dd3d;
    gej_xyz_equals_gej_cold_4();
LAB_0014dd3d:
    psStack_2a0 = (secp256k1_ge *)0x14dd42;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (auStack_290._44_4_ == 0) goto LAB_0014dd33;
    uVar9 = 4;
    do {
      uVar18 = *(ulong *)(auStack_290 + (ulong)uVar9 * 8);
      uVar13 = sStack_230.y.n[(ulong)uVar9 + 1];
      if (uVar13 >= uVar18 && uVar13 != uVar18) {
        psVar23 = (secp256k1_ge *)0x1;
        goto LAB_0014dc70;
      }
      if (uVar13 < uVar18) {
        psVar23 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014dc70;
      }
      bVar27 = uVar9 != 0;
      uVar9 = uVar9 - 1;
    } while (bVar27);
    psVar23 = (secp256k1_ge *)0x0;
LAB_0014dc70:
    psStack_2a0 = (secp256k1_ge *)0x14dc78;
    secp256k1_fe_verify(psVar26);
    psStack_2a0 = (secp256k1_ge *)0x14dc80;
    a_00 = psVar19;
    secp256k1_fe_verify((secp256k1_fe *)psVar19);
    if (sStack_1c8.normalized == 0) goto LAB_0014dd38;
    if (iStack_234 == 0) goto LAB_0014dd3d;
    uVar9 = 4;
    do {
      uVar18 = *(ulong *)(auStack_290 + (ulong)uVar9 * 8 + 0x30);
      uVar13 = sStack_1c8.n[uVar9];
      if (uVar13 >= uVar18 && uVar13 != uVar18) {
        psVar26 = (secp256k1_fe *)0x1;
        goto LAB_0014dcc9;
      }
      if (uVar13 < uVar18) {
        psVar26 = (secp256k1_fe *)0xffffffff;
        goto LAB_0014dcc9;
      }
      bVar27 = uVar9 != 0;
      uVar9 = uVar9 - 1;
    } while (bVar27);
    psVar26 = (secp256k1_fe *)0x0;
LAB_0014dcc9:
    psStack_2a0 = (secp256k1_ge *)0x14dcd1;
    secp256k1_fe_verify(&sStack_198);
    psStack_2a0 = (secp256k1_ge *)0x14dcd9;
    a_00 = &sStack_230;
    secp256k1_fe_verify(&sStack_230.x);
    if (sStack_198.normalized != 0) {
      if (sStack_230.x.normalized != 0) {
        uVar9 = 4;
        do {
          if (sStack_198.n[uVar9] != sStack_230.x.n[uVar9]) {
            return;
          }
          bVar27 = uVar9 != 0;
          uVar9 = uVar9 - 1;
        } while (bVar27);
        return;
      }
      goto LAB_0014dd47;
    }
  }
  psStack_2a0 = (secp256k1_ge *)0x14dd47;
  gej_xyz_equals_gej_cold_2();
LAB_0014dd47:
  psStack_2a0 = (secp256k1_ge *)test_pre_g_table;
  gej_xyz_equals_gej_cold_1();
  r_01 = &sStack_440;
  psStack_4b8 = a_00;
  psStack_2c8 = &sStack_198;
  psStack_2c0 = psVar19;
  psStack_2b8 = psVar22;
  psStack_2b0 = &sStack_230;
  psStack_2a8 = psVar26;
  psStack_2a0 = psVar23;
  secp256k1_ge_from_storage(r_01,(secp256k1_ge_storage *)a_00);
  iVar8 = secp256k1_ge_is_valid_var(r_01);
  if (iVar8 != 0) {
    secp256k1_gej_set_ge(&sStack_360,&sStack_440);
    secp256k1_gej_double_var(&sStack_360,&sStack_360,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStack_4b0,&sStack_360);
    sStack_520._96_8_ = 0x40;
    while( true ) {
      psVar19 = (secp256k1_ge *)(auStack_4b0 + 0x30);
      secp256k1_fe_verify(&sStack_440.x);
      psVar23 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_440.x,1);
      auStack_580._0_8_ = 0x3ffffbfffff0bc - sStack_440.x.n[0];
      auStack_580._8_8_ = 0x3ffffffffffffc - sStack_440.x.n[1];
      auStack_580._16_8_ = 0x3ffffffffffffc - sStack_440.x.n[2];
      auStack_580._24_8_ = 0x3ffffffffffffc - sStack_440.x.n[3];
      auStack_580._32_8_ = 0x3fffffffffffc - sStack_440.x.n[4];
      auStack_580._40_4_ = 2;
      auStack_580._44_4_ = 0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_580);
      secp256k1_fe_verify((secp256k1_fe *)auStack_580);
      r_01 = (secp256k1_ge *)auStack_4b0;
      secp256k1_fe_verify((secp256k1_fe *)r_01);
      if (0x20 < (int)(auStack_4b0._40_4_ + auStack_580._40_4_)) break;
      auStack_580._0_8_ = auStack_580._0_8_ + auStack_4b0._0_8_;
      auStack_580._8_8_ = auStack_580._8_8_ + auStack_4b0._8_8_;
      auStack_580._16_8_ = auStack_580._16_8_ + auStack_4b0._16_8_;
      auStack_580._24_8_ = auStack_580._24_8_ + auStack_4b0._24_8_;
      auStack_580._32_8_ = auStack_580._32_8_ + auStack_4b0._32_8_;
      auStack_580._44_4_ = 0;
      auStack_580._40_4_ = auStack_4b0._40_4_ + auStack_580._40_4_;
      secp256k1_fe_verify((secp256k1_fe *)auStack_580);
      secp256k1_fe_verify((secp256k1_fe *)auStack_580);
      auStack_580._0_8_ = ((ulong)auStack_580._32_8_ >> 0x30) * 0x1000003d1 + auStack_580._0_8_;
      auStack_580._8_8_ = ((ulong)auStack_580._0_8_ >> 0x34) + auStack_580._8_8_;
      auStack_580._16_8_ = ((ulong)auStack_580._8_8_ >> 0x34) + auStack_580._16_8_;
      uVar18 = ((ulong)auStack_580._16_8_ >> 0x34) + auStack_580._24_8_;
      auStack_580._24_8_ = uVar18 & 0xfffffffffffff;
      auStack_580._32_8_ = (uVar18 >> 0x34) + (auStack_580._32_8_ & 0xffffffffffff);
      auStack_580._16_8_ = auStack_580._16_8_ & 0xfffffffffffff;
      auStack_580._8_8_ = auStack_580._8_8_ & 0xfffffffffffff;
      auStack_580._0_8_ = auStack_580._0_8_ & 0xfffffffffffff;
      auStack_580._40_4_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)auStack_580);
      secp256k1_fe_verify(&sStack_440.y);
      psVar23 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_440.y,1);
      auStack_580._48_8_ = 0x3ffffbfffff0bc - sStack_440.y.n[0];
      uStack_548 = 0x3ffffffffffffc - sStack_440.y.n[1];
      uStack_540 = 0x3ffffffffffffc - sStack_440.y.n[2];
      uStack_538 = 0x3ffffffffffffc - sStack_440.y.n[3];
      uStack_530 = 0x3fffffffffffc - sStack_440.y.n[4];
      uStack_528._0_4_ = 2;
      uStack_528._4_4_ = 0;
      psVar22 = (secp256k1_fe *)(auStack_580 + 0x30);
      secp256k1_fe_verify(psVar22);
      secp256k1_fe_verify(psVar22);
      secp256k1_fe_verify((secp256k1_fe *)psVar19);
      r_01 = psVar19;
      if (0x20 < iStack_458 + (int)uStack_528) goto LAB_0014e60e;
      auStack_580._48_8_ = auStack_580._48_8_ + auStack_4b0._48_8_;
      uStack_548 = uStack_548 + uStack_478;
      uStack_540 = uStack_540 + uStack_470;
      uStack_538 = uStack_538 + uStack_468;
      uStack_530 = uStack_530 + uStack_460;
      uStack_528 = (ulong)(uint)(iStack_458 + (int)uStack_528);
      secp256k1_fe_verify(psVar22);
      secp256k1_fe_verify(psVar22);
      auStack_580._48_8_ = (uStack_530 >> 0x30) * 0x1000003d1 + auStack_580._48_8_;
      uStack_548 = ((ulong)auStack_580._48_8_ >> 0x34) + uStack_548;
      uStack_540 = (uStack_548 >> 0x34) + uStack_540;
      uVar18 = (uStack_540 >> 0x34) + uStack_538;
      uStack_538 = uVar18 & 0xfffffffffffff;
      uStack_530 = (uVar18 >> 0x34) + (uStack_530 & 0xffffffffffff);
      uStack_540 = uStack_540 & 0xfffffffffffff;
      uStack_548 = uStack_548 & 0xfffffffffffff;
      auStack_580._48_8_ = auStack_580._48_8_ & 0xfffffffffffff;
      uStack_528 = CONCAT44(uStack_528._4_4_,1);
      secp256k1_fe_verify(psVar22);
      secp256k1_fe_verify((secp256k1_fe *)auStack_580);
      uVar18 = ((ulong)auStack_580._32_8_ >> 0x30) * 0x1000003d1 + auStack_580._0_8_;
      if (((uVar18 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar18 & 0xfffffffffffff) == 0)) {
        uVar13 = (uVar18 >> 0x34) + auStack_580._8_8_;
        uVar16 = (uVar13 >> 0x34) + auStack_580._16_8_;
        uVar20 = (uVar16 >> 0x34) + auStack_580._24_8_;
        uVar21 = (uVar20 >> 0x34) + (auStack_580._32_8_ & 0xffffffffffff);
        if ((((uVar13 | uVar18 | uVar16 | uVar20) & 0xfffffffffffff) != 0 || uVar21 != 0) &&
           ((uVar18 + 0x1000003d0 & uVar13 & uVar16 & uVar20 & (uVar21 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014e212;
        secp256k1_fe_verify(psVar22);
        uVar18 = (uStack_530 >> 0x30) * 0x1000003d1 + auStack_580._48_8_;
        if (((uVar18 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar18 & 0xfffffffffffff) != 0))
        goto LAB_0014e212;
        uVar13 = (uVar18 >> 0x34) + uStack_548;
        a_00 = (secp256k1_ge *)((uVar13 >> 0x34) + uStack_540);
        r_01 = (secp256k1_ge *)(((ulong)a_00 >> 0x34) + uStack_538);
        uVar16 = ((ulong)r_01 >> 0x34) + (uStack_530 & 0xffffffffffff);
        if ((((uVar13 | uVar18 | (ulong)a_00 | (ulong)r_01) & 0xfffffffffffff) != 0 || uVar16 != 0)
           && ((uVar18 + 0x1000003d0 & uVar13 & (ulong)a_00 & (ulong)r_01 &
               (uVar16 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014e212;
        goto LAB_0014e62c;
      }
LAB_0014e212:
      psVar23 = (secp256k1_ge *)((long)(psStack_4b8->x).n + sStack_520._96_8_);
      secp256k1_ge_from_storage(&sStack_3d0,(secp256k1_ge_storage *)psVar23);
      r_01 = &sStack_3d0;
      iVar8 = secp256k1_ge_is_valid_var(&sStack_3d0);
      if (iVar8 == 0) goto LAB_0014e613;
      secp256k1_fe_verify(&sStack_3d0.x);
      psVar23 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_3d0.x,1);
      sStack_520.y.n[0] = 0x3ffffbfffff0bc - sStack_3d0.x.n[0];
      sStack_520.y.n[1] = 0x3ffffffffffffc - sStack_3d0.x.n[1];
      sStack_520.y.n[2] = 0x3ffffffffffffc - sStack_3d0.x.n[2];
      sStack_520.y.n[3] = 0x3ffffffffffffc - sStack_3d0.x.n[3];
      sStack_520.y.n[4] = 0x3fffffffffffc - sStack_3d0.x.n[4];
      sStack_520.y.magnitude = 2;
      sStack_520.y.normalized = 0;
      psVar22 = &sStack_520.y;
      secp256k1_fe_verify(psVar22);
      secp256k1_fe_verify(psVar22);
      r_01 = (secp256k1_ge *)auStack_4b0;
      secp256k1_fe_verify((secp256k1_fe *)r_01);
      if (0x20 < auStack_4b0._40_4_ + sStack_520.y.magnitude) goto LAB_0014e618;
      sStack_520.y.n[0] = sStack_520.y.n[0] + auStack_4b0._0_8_;
      sStack_520.y.n[1] = sStack_520.y.n[1] + auStack_4b0._8_8_;
      sStack_520.y.n[2] = sStack_520.y.n[2] + auStack_4b0._16_8_;
      sStack_520.y.n[3] = sStack_520.y.n[3] + auStack_4b0._24_8_;
      sStack_520.y.n[4] = sStack_520.y.n[4] + auStack_4b0._32_8_;
      sStack_520.y.normalized = 0;
      sStack_520.y.magnitude = auStack_4b0._40_4_ + sStack_520.y.magnitude;
      secp256k1_fe_verify(psVar22);
      sStack_520.x.n[4] = sStack_3d0.y.n[4];
      sStack_520.x.magnitude = sStack_3d0.y.magnitude;
      sStack_520.x.normalized = sStack_3d0.y.normalized;
      sStack_520.x.n[2] = sStack_3d0.y.n[2];
      sStack_520.x.n[3] = sStack_3d0.y.n[3];
      sStack_520.x.n[0] = sStack_3d0.y.n[0];
      sStack_520.x.n[1] = sStack_3d0.y.n[1];
      secp256k1_fe_verify(&sStack_520.x);
      r_01 = (secp256k1_ge *)(auStack_4b0 + 0x30);
      secp256k1_fe_verify((secp256k1_fe *)r_01);
      if (0x20 < iStack_458 + sStack_520.x.magnitude) goto LAB_0014e61d;
      sStack_520.x.n[0] = sStack_520.x.n[0] + auStack_4b0._48_8_;
      sStack_520.x.n[1] = sStack_520.x.n[1] + uStack_478;
      sStack_520.x.n[2] = sStack_520.x.n[2] + uStack_470;
      sStack_520.x.n[3] = sStack_520.x.n[3] + uStack_468;
      sStack_520.x.n[4] = sStack_520.x.n[4] + uStack_460;
      sStack_520.x.normalized = 0;
      sStack_520.x.magnitude = iStack_458 + sStack_520.x.magnitude;
      secp256k1_fe_verify(&sStack_520.x);
      secp256k1_fe_verify(psVar22);
      uVar18 = (sStack_520.y.n[4] >> 0x30) * 0x1000003d1 + sStack_520.y.n[0];
      if (((uVar18 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar18 & 0xfffffffffffff) == 0)) {
        uVar13 = (uVar18 >> 0x34) + sStack_520.y.n[1];
        uVar16 = (uVar13 >> 0x34) + sStack_520.y.n[2];
        uVar20 = (uVar16 >> 0x34) + sStack_520.y.n[3];
        uVar21 = (uVar20 >> 0x34) + (sStack_520.y.n[4] & 0xffffffffffff);
        if ((((uVar13 | uVar18 | uVar16 | uVar20) & 0xfffffffffffff) != 0 || uVar21 != 0) &&
           ((uVar18 + 0x1000003d0 & uVar13 & uVar16 & uVar20 & (uVar21 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014e55f;
        secp256k1_fe_verify(&sStack_520.x);
        uVar18 = (sStack_520.x.n[4] >> 0x30) * 0x1000003d1 + sStack_520.x.n[0];
        if (((uVar18 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar18 & 0xfffffffffffff) != 0))
        goto LAB_0014e55f;
        uVar13 = (uVar18 >> 0x34) + sStack_520.x.n[1];
        a_00 = (secp256k1_ge *)((uVar13 >> 0x34) + sStack_520.x.n[2]);
        r_01 = (secp256k1_ge *)(((ulong)a_00 >> 0x34) + sStack_520.x.n[3]);
        uVar16 = ((ulong)r_01 >> 0x34) + (sStack_520.x.n[4] & 0xffffffffffff);
        if ((((uVar13 | uVar18 | (ulong)a_00 | (ulong)r_01) & 0xfffffffffffff) != 0 || uVar16 != 0)
           && ((uVar18 + 0x1000003d0 & uVar13 & (ulong)a_00 & (ulong)r_01 &
               (uVar16 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014e55f;
        goto LAB_0014e631;
      }
LAB_0014e55f:
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)auStack_580,psVar22);
      psVar23 = (secp256k1_ge *)(auStack_580 + 0x30);
      if ((iVar8 != 0) &&
         (a_00 = &sStack_520, r_01 = psVar23,
         iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar23,&sStack_520.x), iVar8 != 0))
      goto LAB_0014e627;
      secp256k1_fe_mul((secp256k1_fe *)auStack_580,(secp256k1_fe *)auStack_580,&sStack_520.x);
      secp256k1_fe_mul((secp256k1_fe *)psVar23,(secp256k1_fe *)psVar23,&sStack_520.y);
      r_01 = (secp256k1_ge *)auStack_580;
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)auStack_580,(secp256k1_fe *)psVar23);
      if (iVar8 == 0) goto LAB_0014e622;
      psVar23 = &sStack_3d0;
      psVar19 = &sStack_440;
      for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
        (psVar19->x).n[0] = (psVar23->x).n[0];
        psVar23 = (secp256k1_ge *)((long)psVar23 + ((ulong)bVar28 * -2 + 1) * 8);
        psVar19 = (secp256k1_ge *)((long)psVar19 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      sStack_520._96_8_ = sStack_520._96_8_ + 0x40;
      if (sStack_520._96_8_ == 0x80000) {
        return;
      }
    }
    test_pre_g_table_cold_9();
LAB_0014e60e:
    test_pre_g_table_cold_8();
LAB_0014e613:
    test_pre_g_table_cold_7();
LAB_0014e618:
    test_pre_g_table_cold_6();
LAB_0014e61d:
    test_pre_g_table_cold_5();
LAB_0014e622:
    test_pre_g_table_cold_4();
    a_00 = psVar23;
LAB_0014e627:
    test_pre_g_table_cold_3();
LAB_0014e62c:
    test_pre_g_table_cold_1();
LAB_0014e631:
    test_pre_g_table_cold_2();
  }
  test_pre_g_table_cold_10();
  secp256k1_scalar_verify((secp256k1_scalar *)a_00);
  auVar29._0_4_ = -(uint)((int)(a_00->x).n[2] == 0 && (int)(a_00->x).n[0] == 0);
  auVar29._4_4_ =
       -(uint)(*(int *)((long)(a_00->x).n + 0x14) == 0 && *(int *)((long)(a_00->x).n + 4) == 0);
  auVar29._8_4_ = -(uint)((int)(a_00->x).n[3] == 0 && (int)(a_00->x).n[1] == 0);
  auVar29._12_4_ =
       -(uint)(*(int *)((long)(a_00->x).n + 0x1c) == 0 && *(int *)((long)(a_00->x).n + 0xc) == 0);
  iVar8 = movmskps(extraout_EAX,auVar29);
  if (iVar8 == 0xf) {
    if (-1 < (int)(0x7f / (long)(int)count)) {
      memset(r_01,0,(0x7f / (long)(int)count & 0xffffffffU) * 4 + 4);
    }
  }
  else {
    secp256k1_scalar_verify((secp256k1_scalar *)a_00);
    uVar7 = (a_00->x).n[0];
    uVar10 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,0,count);
    *(uint32_t *)(r_01->x).n = uVar10 + (~(uint)uVar7 & 1);
    iVar8 = (int)(0x7f / (long)(int)count);
    uVar9 = iVar8 * count;
    uVar25 = 0x80 - uVar9;
    uVar18 = 0x7f / (long)(int)count & 0xffffffff;
    if (0 < iVar8) {
      lVar11 = 0;
      uVar13 = uVar18;
      do {
        uVar12 = count;
        if (lVar11 == 0) {
          uVar12 = uVar25;
        }
        uVar10 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,uVar9,uVar12);
        if (uVar10 != 0) goto LAB_0014e710;
        *(undefined4 *)((long)(r_01->x).n + uVar13 * 4) = 0;
        uVar9 = uVar9 - count;
        lVar11 = lVar11 + 1;
        bVar27 = 1 < (long)uVar13;
        uVar13 = uVar13 - 1;
      } while (bVar27);
      uVar13 = 0;
LAB_0014e710:
      iVar8 = (int)uVar13;
    }
    if (0 < iVar8) {
      uVar13 = 1;
      uVar9 = count;
      do {
        uVar12 = count;
        if (uVar18 == uVar13) {
          uVar12 = uVar25;
        }
        uVar10 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,uVar9,uVar12);
        if ((uVar10 & 1) == 0) {
          piVar2 = (int *)((long)(r_01->x).n + uVar13 * 4 + -4);
          *piVar2 = *piVar2 + (-1 << ((byte)count & 0x1f));
          uVar10 = uVar10 | 1;
        }
        *(uint32_t *)((long)(r_01->x).n + uVar13 * 4) = uVar10;
        if ((1 < uVar13) &&
           (((iVar3 = *(int *)((long)(r_01->x).n + uVar13 * 4 + -4), iVar3 == 1 &&
             (*(int *)((long)(r_01->x).n + uVar13 * 4 + -8) < 0)) ||
            ((iVar3 == -1 && (0 < *(int *)((long)(r_01->x).n + uVar13 * 4 + -8))))))) {
          piVar2 = (int *)((long)(r_01->x).n + uVar13 * 4 + -8);
          *piVar2 = *piVar2 + ((uint)(iVar3 == 1) * 2 + -1 << ((byte)count & 0x1f));
          *(undefined4 *)((long)(r_01->x).n + uVar13 * 4 + -4) = 0;
        }
        uVar13 = uVar13 + 1;
        uVar9 = uVar9 + count;
      } while (iVar8 + 1 != uVar13);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}